

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

void __thiscall TRM::Vertex::insert_above(Vertex *this,Edge *e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Edge *pEVar5;
  Edge **ppEVar6;
  Edge *pEVar7;
  LinkedList<TRM::Edge> *pLVar8;
  bool bVar9;
  
  fVar1 = (e->top->point).field_0.x;
  fVar2 = (e->top->point).field_1.y;
  fVar3 = (e->bottom->point).field_0.x;
  fVar4 = (e->bottom->point).field_1.y;
  if ((fVar1 == fVar3) && (!NAN(fVar1) && !NAN(fVar3))) {
    if ((fVar2 == fVar4) && (!NAN(fVar2) && !NAN(fVar4))) {
      return;
    }
  }
  if ((fVar4 < fVar2) || (fVar3 < fVar1 && fVar4 == fVar2)) {
    return;
  }
  pEVar5 = (this->edge_above).head;
  bVar9 = pEVar5 == (Edge *)0x0;
  if (!bVar9) {
    if (0.0 <= pEVar5->le_a * (double)fVar1 + pEVar5->le_b * (double)fVar2 + pEVar5->le_c) {
      do {
        pEVar7 = pEVar5;
        pEVar5 = pEVar7->above_next;
        bVar9 = pEVar5 == (Edge *)0x0;
        if (bVar9) break;
      } while (0.0 <= pEVar5->le_a * (double)fVar1 + pEVar5->le_b * (double)fVar2 + pEVar5->le_c);
      goto LAB_0011b6fa;
    }
  }
  pEVar7 = (Edge *)0x0;
LAB_0011b6fa:
  e->above_prev = pEVar7;
  e->above_next = pEVar5;
  pLVar8 = (LinkedList<TRM::Edge> *)&pEVar7->above_next;
  if (pEVar7 == (Edge *)0x0) {
    pLVar8 = &this->edge_above;
  }
  pLVar8->head = e;
  ppEVar6 = &pEVar5->above_prev;
  if (bVar9) {
    ppEVar6 = &(this->edge_above).tail;
  }
  *ppEVar6 = e;
  return;
}

Assistant:

void Vertex::insert_above(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not above
  ) {
    return;
  }

  Edge* above_prev = nullptr;
  Edge* above_next = nullptr;

  for (above_next = edge_above.head; above_next != nullptr;
       above_next = above_next->above_next) {
    if (above_next->is_right_of(e->top->point)) {
      break;
    }

    above_prev = above_next;
  }

  LinkedList<Edge>::Insert<&Edge::above_prev, &Edge::above_next>(
      e, above_prev, above_next, &edge_above.head, &edge_above.tail);
}